

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlnRetime.c
# Opt level: O0

void Wln_RetFindSources(Wln_Ret_t *p)

{
  int iVar1;
  int local_14;
  int iObj;
  int i;
  Wln_Ret_t *p_local;
  
  Vec_IntClear(&p->vSources);
  Wln_NtkIncrementTravId(p->pNtk);
  for (local_14 = 0; iVar1 = Vec_IntSize(&p->vSinks), local_14 < iVar1; local_14 = local_14 + 1) {
    iVar1 = Vec_IntEntry(&p->vSinks,local_14);
    Wln_RetFindSources_rec(p,iVar1);
  }
  return;
}

Assistant:

void Wln_RetFindSources( Wln_Ret_t * p )
{
    int i, iObj;
    Vec_IntClear( &p->vSources );
    Wln_NtkIncrementTravId( p->pNtk );
    Vec_IntForEachEntry( &p->vSinks, iObj, i )
        Wln_RetFindSources_rec( p, iObj );

//    printf( "Sources: " );
//    Vec_IntPrint( &p->vSources );
}